

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void update_bitmap_after_coalescing(gen_ctx_t gen_ctx,bitmap_t bm)

{
  lr_gap_t *plVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  VARR_MIR_reg_t *pVVar5;
  MIR_func_t func;
  bitmap_t bm_00;
  gen_ctx_t dst;
  VARR_reg_info_t *pVVar6;
  VARR_allocno_info_t *pVVar7;
  VARR_bitmap_t *pVVar8;
  bitmap_t *ppVVar9;
  VARR_bitmap_t *pVVar10;
  VARR_live_range_t *pVVar11;
  live_range *plVar12;
  VARR_lr_gap_t *pVVar13;
  bitmap_t *ppVVar14;
  FILE *pFVar15;
  lr_gap_t *plVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 lr;
  MIR_type_t MVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  ulong *puVar24;
  gen_ctx_t pgVar25;
  char *pcVar26;
  gen_ctx_t gen_ctx_00;
  MIR_item_t_conflict pMVar27;
  live_range_t_conflict plVar28;
  MIR_item_t pMVar29;
  ra_ctx *prVar30;
  bitmap_t pVVar31;
  bitmap_el_t *pbVar32;
  size_t sVar33;
  MIR_module_t pMVar34;
  void *pvVar35;
  ulong uVar36;
  live_range *plVar37;
  MIR_item_t_conflict pMVar38;
  bitmap_t unaff_RBX;
  uint uVar39;
  uint uVar40;
  VARR_allocno_info_t *pVVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  bool bVar45;
  ulong uVar46;
  char *pcVar47;
  bool bVar48;
  gen_ctx_t gen_ctx_01;
  live_range *in_R8;
  size_t unaff_R12;
  lr_bb_t_conflict plVar49;
  MIR_reg_t reg;
  ulong unaff_R13;
  MIR_item_t lr_00;
  gen_ctx_t unaff_R14;
  MIR_item_t_conflict pMVar50;
  ulong unaff_R15;
  MIR_item_t_conflict lr_01;
  ulong uVar51;
  lr_gap_t el;
  lr_gap_t el_00;
  lr_gap_t el_01;
  lr_gap_t el_02;
  ulong in_stack_fffffffffffffea0;
  MIR_reg_t MStack_14c;
  uint uStack_108;
  int iStack_104;
  uint uStack_e0;
  undefined1 auStack_dc [20];
  ra_ctx *prStack_c8;
  MIR_reg_t MStack_bc;
  MIR_item_t_conflict pMStack_b8;
  ulong uStack_b0;
  undefined1 auStack_a8 [16];
  long lStack_98;
  live_range_t plStack_90;
  gen_ctx_t pgStack_88;
  MIR_item_t_conflict pMStack_80;
  live_range lStack_78;
  bitmap_t pVStack_58;
  size_t sStack_50;
  ulong uStack_48;
  gen_ctx_t pgStack_40;
  ulong uStack_38;
  
  if (bm != (bitmap_t)0x0) {
    uVar43 = bm->els_num;
    if (uVar43 != 0) {
      pbVar32 = bm->varr;
      unaff_R12 = 1;
      uVar36 = 0;
      unaff_R15 = 0;
      gen_ctx_01 = gen_ctx;
      do {
        while ((pbVar32[uVar36] == 0 ||
               (uVar46 = pbVar32[uVar36] >> (unaff_R15 & 0x3f), uVar46 == 0))) {
          uVar36 = uVar36 + 1;
          unaff_R15 = uVar36 * 0x40;
          if (uVar43 == uVar36) {
            return;
          }
        }
        uVar36 = uVar46 & 1;
        while (uVar36 == 0) {
          unaff_R15 = unaff_R15 + 1;
          uVar36 = uVar46 & 2;
          uVar46 = uVar46 >> 1;
        }
        if (0x21 < (uint)unaff_R15) {
          pVVar5 = gen_ctx->coalesce_ctx->first_coalesced_reg;
          unaff_RBX = bm;
          unaff_R14 = gen_ctx;
          if (((pVVar5 == (VARR_MIR_reg_t *)0x0) ||
              (gen_ctx_01 = (gen_ctx_t)pVVar5->varr, gen_ctx_01 == (gen_ctx_t)0x0)) ||
             (uVar36 = unaff_R15 & 0xffffffff, pVVar5->els_num <= uVar36)) goto LAB_0016b036;
          uVar40 = *(uint *)((long)gen_ctx_01->call_used_hard_regs + uVar36 * 4 + -0x68);
          unaff_R13 = (ulong)uVar40;
          if (uVar40 != (uint)unaff_R15) {
            if (uVar36 < uVar43 * 0x40) {
              bVar17 = (byte)unaff_R15 & 0x3f;
              pbVar32[unaff_R15 >> 6 & 0x3ffffff] =
                   pbVar32[unaff_R15 >> 6 & 0x3ffffff] &
                   (-2L << bVar17 | 0xfffffffffffffffeU >> 0x40 - bVar17);
            }
            gen_ctx_01 = (gen_ctx_t)bm;
            bitmap_expand(bm,unaff_R13 + 1);
            pbVar32 = bm->varr;
            pbVar32[uVar40 >> 6] = pbVar32[uVar40 >> 6] | 1L << (unaff_R13 & 0x3f);
          }
        }
        uVar43 = bm->els_num;
        unaff_R15 = unaff_R15 + 1;
        uVar36 = unaff_R15 >> 6;
      } while (uVar36 < uVar43);
    }
    return;
  }
  update_bitmap_after_coalescing_cold_2();
  gen_ctx_01 = gen_ctx;
LAB_0016b036:
  update_bitmap_after_coalescing_cold_1();
  gen_ctx_00 = (gen_ctx_t)gen_ctx_01->ctx;
  uVar40 = gen_ctx_01->curr_cfg->max_var;
  pcVar47 = (char *)gen_ctx_01->curr_func_item->module;
  func = (gen_ctx_01->curr_func_item->u).func;
  pgStack_88 = gen_ctx_00;
  pVStack_58 = unaff_RBX;
  sStack_50 = unaff_R12;
  uStack_48 = unaff_R13;
  pgStack_40 = unaff_R14;
  uStack_38 = unaff_R15;
  puVar24 = (ulong *)_MIR_get_module_global_var_hard_regs
                               ((MIR_context_t)gen_ctx_00,(MIR_module_t_conflict)pcVar47);
  prVar30 = gen_ctx_01->ra_ctx;
  uVar2 = gen_ctx_01->optimize_level;
  bm_00 = gen_ctx_01->temp_bitmap2;
  dst = (gen_ctx_t)prVar30->conflict_locs1;
  gen_ctx_01->func_stack_slots_num = 0;
  pVVar6 = gen_ctx_01->curr_cfg->reg_info;
  if (pVVar6 == (VARR_reg_info_t *)0x0) goto LAB_0016cc96;
  prVar30->curr_reg_infos = pVVar6->varr;
  pVVar5 = prVar30->reg_renumber;
  if ((pVVar5 == (VARR_MIR_reg_t *)0x0) || (pVVar5->varr == (MIR_reg_t *)0x0)) {
LAB_0016cc78:
    assign_cold_65();
  }
  else {
    pVVar41 = (VARR_allocno_info_t *)0x0;
    pVVar5->els_num = 0;
    do {
      pVVar5 = gen_ctx_01->ra_ctx->reg_renumber;
      pgVar25 = (gen_ctx_t)pVVar5->varr;
      if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cbaa;
      sVar33 = pVVar5->els_num;
      uVar43 = sVar33 + 1;
      if (pVVar5->size < uVar43) {
        unaff_R12 = (uVar43 >> 1) + uVar43;
        pcVar47 = (char *)(unaff_R12 * 4);
        gen_ctx_00 = pgVar25;
        pgVar25 = (gen_ctx_t)realloc(pgVar25,(size_t)pcVar47);
        pVVar5->varr = (MIR_reg_t *)pgVar25;
        pVVar5->size = unaff_R12;
        sVar33 = pVVar5->els_num;
        uVar43 = sVar33 + 1;
      }
      uVar23 = (uint)unaff_R12;
      uVar39 = (int)pVVar41 + 1;
      pVVar41 = (VARR_allocno_info_t *)(ulong)uVar39;
      pVVar5->els_num = uVar43;
      *(undefined4 *)((long)pgVar25->call_used_hard_regs + sVar33 * 4 + -0x68) = 0xffffffff;
    } while (uVar39 <= uVar40);
    prVar30 = gen_ctx_01->ra_ctx;
    pVVar7 = prVar30->sorted_regs;
    if ((pVVar7 != (VARR_allocno_info_t *)0x0) && (pVVar7->varr != (allocno_info_t *)0x0)) {
      pVVar7->els_num = 0;
      auStack_dc._12_8_ = prVar30->curr_reg_infos;
      prVar30->start_mem_loc = 0x22;
      if (0x21 < uVar40) {
        uVar39 = 0x22;
        do {
          pVVar31 = gen_ctx_01->tied_regs;
          if (pVVar31 == (bitmap_t)0x0) goto LAB_0016cbc3;
          uVar43 = (ulong)uVar39;
          if (uVar43 < pVVar31->els_num << 6) {
            uVar36 = (ulong)((uint)(pVVar31->varr[uVar39 >> 6] >> (uVar43 & 0x3f)) & 1) << 0x20;
          }
          else {
            uVar36 = 0;
          }
          pVVar31 = gen_ctx_01->addr_regs;
          if (pVVar31 == (bitmap_t)0x0) goto LAB_0016cbc8;
          if ((uVar43 < pVVar31->els_num << 6) &&
             ((pVVar31->varr[uVar39 >> 6] >> (uVar43 & 0x3f) & 1) != 0)) {
            gen_ctx_00 = (gen_ctx_t)gen_ctx_01->ctx;
            MVar20 = MIR_reg_type((MIR_context_t)gen_ctx_00,uVar39 - 0x21,func);
            sVar33 = gen_ctx_01->func_stack_slots_num;
            unaff_R12 = 1;
            pcVar47 = (char *)0x0;
            do {
              uVar23 = 2;
              if ((int)pcVar47 == 0) {
                uVar23 = (uint)sVar33;
                pVVar41 = (VARR_allocno_info_t *)(ulong)(uVar23 + 0x22);
                bVar45 = uVar23 < 0xffffffde && MVar20 == MIR_T_LD;
                unaff_R12 = (size_t)(bVar45 + 1);
                uVar23 = (uint)((bVar45 & uVar23) == 0);
              }
              sVar33 = sVar33 + 1;
              pcVar47 = (char *)(ulong)uVar23;
            } while (uVar23 < (uint)unaff_R12);
            gen_ctx_01->func_stack_slots_num = sVar33;
            prVar30 = gen_ctx_01->ra_ctx;
            pVVar5 = prVar30->reg_renumber;
            if (((pVVar5 == (VARR_MIR_reg_t *)0x0) || (pVVar5->varr == (MIR_reg_t *)0x0)) ||
               (pVVar5->els_num <= uVar43)) goto LAB_0016cbd2;
            pVVar5->varr[uVar43] = (MIR_reg_t)pVVar41;
            prVar30->start_mem_loc = (MIR_reg_t)pVVar41 + (uint)unaff_R12;
            pgVar25 = (gen_ctx_t)gen_ctx_01->debug_file;
            if ((pgVar25 != (gen_ctx_t)0x0) && (1 < gen_ctx_01->debug_level)) {
              pcVar26 = MIR_reg_name(gen_ctx_01->ctx,uVar39 - 0x21,func);
              pcVar47 = " Assigning to addressable %s:reg=%3u (freq %-3ld) -- %lu\n";
              in_R8 = (live_range *)gen_ctx_01->ra_ctx->curr_reg_infos[uVar43].freq;
              fprintf((FILE *)pgVar25," Assigning to addressable %s:reg=%3u (freq %-3ld) -- %lu\n",
                      pcVar26,uVar43,in_R8,(ulong)pVVar41 & 0xffffffff);
              gen_ctx_00 = pgVar25;
            }
          }
          else {
            pVVar41 = gen_ctx_01->ra_ctx->sorted_regs;
            pgVar25 = (gen_ctx_t)pVVar41->varr;
            if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cbd7;
            sVar33 = pVVar41->els_num;
            uVar46 = sVar33 + 1;
            if (pVVar41->size < uVar46) {
              sVar33 = (uVar46 >> 1) + uVar46;
              gen_ctx_00 = pgVar25;
              pgVar25 = (gen_ctx_t)realloc(pgVar25,sVar33 * 0x10);
              pVVar41->varr = (allocno_info_t *)pgVar25;
              pVVar41->size = sVar33;
              sVar33 = pVVar41->els_num;
              uVar46 = sVar33 + 1;
            }
            pVVar41->els_num = uVar46;
            pgVar25->call_used_hard_regs[sVar33 * 2 + -0xd] = (bitmap_t)(uVar36 | uVar43);
            pgVar25->call_used_hard_regs[sVar33 * 2 + -0xc] = (bitmap_t)auStack_dc._12_8_;
            pVVar11 = gen_ctx_01->lr_ctx->var_live_ranges;
            if (((pVVar11 == (VARR_live_range_t *)0x0) ||
                (pVVar11->varr == (live_range_t_conflict *)0x0)) || (pVVar11->els_num <= uVar43))
            goto LAB_0016cba5;
            sVar33 = 0;
            for (plVar28 = pVVar11->varr[uVar43]; plVar28 != (live_range_t_conflict)0x0;
                plVar28 = plVar28->next) {
              sVar33 = sVar33 + (long)((plVar28->finish - plVar28->start) + 1);
            }
            gen_ctx_01->ra_ctx->curr_reg_infos[uVar43].live_length = sVar33;
            pcVar47 = (char *)auStack_dc._12_8_;
          }
          uVar23 = (uint)unaff_R12;
          uVar39 = uVar39 + 1;
        } while (uVar39 <= uVar40);
      }
      auStack_dc._0_4_ = uVar23;
      if (-1 < gen_ctx_01->lr_ctx->curr_point) {
        uVar43 = 0;
        do {
          prVar30 = gen_ctx_01->ra_ctx;
          pVVar8 = prVar30->used_locs;
          if (pVVar8 == (VARR_bitmap_t *)0x0) goto LAB_0016cbf0;
          uVar36 = pVVar8->els_num;
          pcVar47 = (char *)(long)(int)uVar36;
          if ((long)pcVar47 <= (long)uVar43) break;
          ppVVar9 = pVVar8->varr;
          bVar45 = ppVVar9 != (bitmap_t *)0x0;
          pcVar47 = (char *)CONCAT71((int7)(int3)(uVar36 >> 8),bVar45);
          if (puVar24 == (ulong *)0x0) {
            if (uVar36 <= uVar43 || !bVar45) goto LAB_0016cc40;
            pVVar31 = ppVVar9[uVar43];
            if ((pVVar31 == (bitmap_t)0x0) || (pVVar31->varr == (bitmap_el_t *)0x0))
            goto LAB_0016cbff;
            pVVar31->els_num = 0;
            if (uVar2 < 2) goto LAB_0016b660;
            pVVar8 = prVar30->busy_used_locs;
            if (((pVVar8 == (VARR_bitmap_t *)0x0) || (pVVar8->varr == (bitmap_t *)0x0)) ||
               (pVVar8->els_num <= uVar43)) goto LAB_0016cc1d;
            pVVar31 = pVVar8->varr[uVar43];
            if ((pVVar31 == (bitmap_t)0x0) || (pVVar31->varr == (bitmap_el_t *)0x0))
            goto LAB_0016cc3b;
            pVVar31->els_num = 0;
          }
          else {
            if (uVar36 <= uVar43 || !bVar45) goto LAB_0016cc18;
            pVVar31 = ppVVar9[uVar43];
            if (pVVar31 == (bitmap_t)0x0) goto LAB_0016cc13;
            uVar36 = pVVar31->els_num;
            uVar46 = *puVar24;
            if (uVar46 <= uVar36) {
              gen_ctx_00 = (gen_ctx_t)pVVar31->varr;
              if (gen_ctx_00 != (gen_ctx_t)0x0) {
                pVVar31->els_num = uVar46;
                goto LAB_0016b56a;
              }
              assign_cold_7();
LAB_0016cc6e:
              assign_cold_10();
LAB_0016cc73:
              assign_cold_38();
              goto LAB_0016cc78;
            }
            lVar42 = (uVar46 & 0x3ffffffffffffff) - uVar36;
            if ((uVar46 & 0x3ffffffffffffff) < uVar36 || lVar42 == 0) {
              gen_ctx_00 = (gen_ctx_t)pVVar31->varr;
            }
            else {
              gen_ctx_00 = (gen_ctx_t)pVVar31->varr;
              do {
                if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_0016cb96;
                sVar33 = pVVar31->els_num;
                uVar36 = sVar33 + 1;
                if (pVVar31->size < uVar36) {
                  sVar33 = (uVar36 >> 1) + uVar36;
                  gen_ctx_00 = (gen_ctx_t)realloc(gen_ctx_00,sVar33 * 8);
                  pVVar31->varr = (bitmap_el_t *)gen_ctx_00;
                  pVVar31->size = sVar33;
                  sVar33 = pVVar31->els_num;
                  uVar36 = sVar33 + 1;
                }
                lVar42 = lVar42 + -1;
                pVVar31->els_num = uVar36;
                gen_ctx_00->call_used_hard_regs[sVar33 - 0xd] = (bitmap_t)0x0;
              } while (lVar42 != 0);
            }
LAB_0016b56a:
            pcVar47 = (char *)puVar24[2];
            memcpy(gen_ctx_00,pcVar47,uVar46 << 3);
            if (uVar2 < 2) goto LAB_0016b660;
            pVVar8 = gen_ctx_01->ra_ctx->busy_used_locs;
            if (((pVVar8 == (VARR_bitmap_t *)0x0) || (pVVar8->varr == (bitmap_t *)0x0)) ||
               (pVVar8->els_num <= uVar43)) goto LAB_0016cbf5;
            pVVar31 = pVVar8->varr[uVar43];
            if (pVVar31 == (bitmap_t)0x0) goto LAB_0016cc6e;
            uVar36 = pVVar31->els_num;
            uVar46 = *puVar24;
            if (uVar36 < uVar46) {
              lVar42 = (uVar46 & 0x3ffffffffffffff) - uVar36;
              if ((uVar46 & 0x3ffffffffffffff) < uVar36 || lVar42 == 0) {
                gen_ctx_00 = (gen_ctx_t)pVVar31->varr;
              }
              else {
                gen_ctx_00 = (gen_ctx_t)pVVar31->varr;
                do {
                  if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_0016cbb9;
                  sVar33 = pVVar31->els_num;
                  uVar36 = sVar33 + 1;
                  if (pVVar31->size < uVar36) {
                    sVar33 = (uVar36 >> 1) + uVar36;
                    gen_ctx_00 = (gen_ctx_t)realloc(gen_ctx_00,sVar33 * 8);
                    pVVar31->varr = (bitmap_el_t *)gen_ctx_00;
                    pVVar31->size = sVar33;
                    sVar33 = pVVar31->els_num;
                    uVar36 = sVar33 + 1;
                  }
                  lVar42 = lVar42 + -1;
                  pVVar31->els_num = uVar36;
                  gen_ctx_00->call_used_hard_regs[sVar33 - 0xd] = (bitmap_t)0x0;
                } while (lVar42 != 0);
              }
            }
            else {
              gen_ctx_00 = (gen_ctx_t)pVVar31->varr;
              if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_0016cc87;
              pVVar31->els_num = uVar46;
            }
            pcVar47 = (char *)puVar24[2];
            memcpy(gen_ctx_00,pcVar47,uVar46 << 3);
          }
LAB_0016b660:
          bVar45 = (long)uVar43 < (long)gen_ctx_01->lr_ctx->curr_point;
          uVar43 = uVar43 + 1;
        } while (bVar45);
      }
LAB_0016b8d7:
      prVar30 = gen_ctx_01->ra_ctx;
      if (prVar30->used_locs != (VARR_bitmap_t *)0x0) {
        if (gen_ctx_01->lr_ctx->curr_point < (int)prVar30->used_locs->els_num) {
          pVVar41 = prVar30->sorted_regs;
          if (pVVar41 == (VARR_allocno_info_t *)0x0) goto LAB_0016cc9b;
          auStack_dc._4_8_ = pVVar41->els_num;
          gen_ctx_00 = (gen_ctx_t)pVVar41->varr;
          pcVar47 = (char *)(long)(int)auStack_dc._4_8_;
          qsort(gen_ctx_00,(size_t)pcVar47,0x10,allocno_info_compare_func);
          pVVar8 = gen_ctx_01->ra_ctx->used_locs;
          if (pVVar8 == (VARR_bitmap_t *)0x0) goto LAB_0016cca0;
          pVVar10 = gen_ctx_01->ra_ctx->busy_used_locs;
          if (pVVar10 == (VARR_bitmap_t *)0x0) goto LAB_0016cca5;
          ppVVar9 = pVVar8->varr;
          auStack_dc._12_8_ = pVVar10->varr;
          pMVar27 = (MIR_item_t_conflict)0x0;
          goto LAB_0016b967;
        }
        pMVar27 = (MIR_item_t_conflict)malloc(0x18);
        gen_ctx_00 = (gen_ctx_t)0x8;
        pMVar27->data = (void *)0x0;
        pMVar27->module = (MIR_module_t)0x1;
        pgVar25 = (gen_ctx_t)malloc(8);
        (pMVar27->item_link).prev = (MIR_item_t)pgVar25;
        if (puVar24 != (ulong *)0x0) {
          uVar43 = *puVar24;
          if (uVar43 == 0) {
            if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cc04;
            pMVar27->data = (void *)0x0;
          }
          else {
            uVar36 = uVar43 & 0x3ffffffffffffff;
            if (uVar36 != 0) {
LAB_0016b6ce:
              if (pgVar25 != (gen_ctx_t)0x0) goto code_r0x0016b6d7;
              assign_cold_19();
LAB_0016cb7d:
              assign_cold_45();
              goto LAB_0016cb82;
            }
          }
LAB_0016b733:
          pcVar47 = (char *)puVar24[2];
          memcpy(pgVar25,pcVar47,uVar43 << 3);
          prVar30 = gen_ctx_01->ra_ctx;
          gen_ctx_00 = pgVar25;
        }
        pVVar8 = prVar30->used_locs;
        pgVar25 = (gen_ctx_t)pVVar8->varr;
        if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cbb4;
        sVar33 = pVVar8->els_num;
        uVar43 = sVar33 + 1;
        if (pVVar8->size < uVar43) {
          sVar33 = (uVar43 >> 1) + uVar43;
          pcVar47 = (char *)(sVar33 * 8);
          gen_ctx_00 = pgVar25;
          pgVar25 = (gen_ctx_t)realloc(pgVar25,(size_t)pcVar47);
          pVVar8->varr = (bitmap_t *)pgVar25;
          pVVar8->size = sVar33;
          sVar33 = pVVar8->els_num;
          uVar43 = sVar33 + 1;
        }
        pVVar8->els_num = uVar43;
        pgVar25->call_used_hard_regs[sVar33 - 0xd] = (bitmap_t)pMVar27;
        if (1 < uVar2) {
          pMVar27 = (MIR_item_t_conflict)malloc(0x18);
          gen_ctx_00 = (gen_ctx_t)0x8;
          pMVar27->data = (void *)0x0;
          pMVar27->module = (MIR_module_t)0x1;
          pgVar25 = (gen_ctx_t)malloc(8);
          (pMVar27->item_link).prev = (MIR_item_t)pgVar25;
          if (puVar24 != (ulong *)0x0) {
            uVar43 = *puVar24;
            if (uVar43 == 0) {
              if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cc45;
              pMVar27->data = (void *)0x0;
            }
            else {
              for (uVar36 = uVar43 & 0x3ffffffffffffff; uVar36 != 0; uVar36 = uVar36 - 1) {
                if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cb82;
                pvVar35 = pMVar27->data;
                pMVar34 = (MIR_module_t)((long)pvVar35 + 1);
                if (pMVar27->module < pMVar34) {
                  pMVar34 = (MIR_module_t)((long)&pMVar34->data + ((ulong)pMVar34 >> 1));
                  pgVar25 = (gen_ctx_t)realloc(pgVar25,(long)pMVar34 * 8);
                  (pMVar27->item_link).prev = (MIR_item_t)pgVar25;
                  pMVar27->module = pMVar34;
                  pvVar35 = pMVar27->data;
                  pMVar34 = (MIR_module_t)((long)pvVar35 + 1);
                }
                pMVar27->data = pMVar34;
                pgVar25->call_used_hard_regs[(long)pvVar35 + -0xd] = (bitmap_t)0x0;
              }
            }
            pcVar47 = (char *)puVar24[2];
            memcpy(pgVar25,pcVar47,uVar43 << 3);
            gen_ctx_00 = pgVar25;
          }
          pVVar8 = gen_ctx_01->ra_ctx->busy_used_locs;
          pgVar25 = (gen_ctx_t)pVVar8->varr;
          if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cbcd;
          sVar33 = pVVar8->els_num;
          uVar43 = sVar33 + 1;
          if (pVVar8->size < uVar43) {
            sVar33 = (uVar43 >> 1) + uVar43;
            pcVar47 = (char *)(sVar33 * 8);
            gen_ctx_00 = pgVar25;
            pgVar25 = (gen_ctx_t)realloc(pgVar25,(size_t)pcVar47);
            pVVar8->varr = (bitmap_t *)pgVar25;
            pVVar8->size = sVar33;
            sVar33 = pVVar8->els_num;
            uVar43 = sVar33 + 1;
          }
          pVVar8->els_num = uVar43;
          pgVar25->call_used_hard_regs[sVar33 - 0xd] = (bitmap_t)pMVar27;
        }
        goto LAB_0016b8d7;
      }
      goto LAB_0016cbaf;
    }
  }
  assign_cold_63();
  goto LAB_0016cc82;
code_r0x0016b6d7:
  pvVar35 = pMVar27->data;
  pMVar34 = (MIR_module_t)((long)pvVar35 + 1);
  if (pMVar27->module < pMVar34) {
    pMVar34 = (MIR_module_t)((long)&pMVar34->data + ((ulong)pMVar34 >> 1));
    pgVar25 = (gen_ctx_t)realloc(pgVar25,(long)pMVar34 * 8);
    (pMVar27->item_link).prev = (MIR_item_t)pgVar25;
    pMVar27->module = pMVar34;
    pvVar35 = pMVar27->data;
    pMVar34 = (MIR_module_t)((long)pvVar35 + 1);
  }
  uVar36 = uVar36 - 1;
  pMVar27->data = pMVar34;
  pgVar25->call_used_hard_regs[(long)pvVar35 + -0xd] = (bitmap_t)0x0;
  if (uVar36 == 0) goto LAB_0016b733;
  goto LAB_0016b6ce;
LAB_0016cb82:
  assign_cold_21();
LAB_0016cb87:
  assign_cold_58();
LAB_0016cb8c:
  assign_cold_56();
LAB_0016cb91:
  assign_cold_55();
LAB_0016cb96:
  assign_cold_12();
LAB_0016cb9b:
  assign_cold_49();
LAB_0016cba0:
  assign_cold_43();
LAB_0016cba5:
  assign_cold_2();
LAB_0016cbaa:
  assign_cold_64();
LAB_0016cbaf:
  assign_cold_62();
LAB_0016cbb4:
  assign_cold_24();
LAB_0016cbb9:
  assign_cold_9();
LAB_0016cbbe:
  assign_cold_54();
LAB_0016cbc3:
  assign_cold_5();
LAB_0016cbc8:
  assign_cold_4();
LAB_0016cbcd:
  assign_cold_23();
LAB_0016cbd2:
  assign_cold_1();
LAB_0016cbd7:
  assign_cold_3();
LAB_0016cbdc:
  assign_cold_34();
LAB_0016cbe1:
  assign_cold_28();
LAB_0016cbe6:
  assign_cold_53();
LAB_0016cbeb:
  assign_cold_29();
LAB_0016cbf0:
  assign_cold_18();
LAB_0016cbf5:
  assign_cold_11();
LAB_0016cbfa:
  assign_cold_35();
LAB_0016cbff:
  assign_cold_17();
LAB_0016cc04:
  assign_cold_20();
LAB_0016cc09:
  assign_cold_47();
LAB_0016cc0e:
  assign_cold_48();
LAB_0016cc13:
  assign_cold_13();
LAB_0016cc18:
  assign_cold_6();
LAB_0016cc1d:
  assign_cold_16();
LAB_0016cc22:
  assign_cold_32();
LAB_0016cc27:
  assign_cold_37();
LAB_0016cc2c:
  assign_cold_50();
LAB_0016cc31:
  assign_cold_51();
LAB_0016cc36:
  assign_cold_52();
LAB_0016cc3b:
  assign_cold_15();
LAB_0016cc40:
  assign_cold_14();
LAB_0016cc45:
  assign_cold_22();
LAB_0016cc4a:
  __assert_fail("hard_reg >= 0 && hard_reg <= ST1_HARD_REG && target_locs_num (hard_reg, type) == 1"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1dac,"void assign(gen_ctx_t)");
  while( true ) {
    plVar28 = pVVar11->varr[(long)pMVar27];
    pMVar50 = (MIR_item_t_conflict)((long)&pMVar27->data + 1);
    if (plVar28 != (live_range_t_conflict)0x0) {
      uVar43 = 1L << ((ulong)pMVar27 & 0x3f);
      do {
        if (plVar28->start <= plVar28->finish) {
          lVar42 = (long)plVar28->start + -1;
          do {
            pgVar25 = (gen_ctx_t)ppVVar9[lVar42 + 1];
            pcVar47 = (char *)pMVar50;
            gen_ctx_00 = pgVar25;
            bitmap_expand((bitmap_t)pgVar25,(size_t)pMVar50);
            if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cb02;
            pMVar27 = ((DLIST_MIR_item_t *)&pgVar25->curr_func_item)->head;
            pMVar27->data = (void *)((ulong)pMVar27->data | uVar43);
            if (1 < uVar2) {
              pgVar25 = (gen_ctx_t)((MIR_module_t *)(auStack_dc._12_8_ + 8))[lVar42];
              pcVar47 = (char *)pMVar50;
              gen_ctx_00 = pgVar25;
              bitmap_expand((bitmap_t)pgVar25,(size_t)pMVar50);
              if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cb07;
              pMVar27 = ((DLIST_MIR_item_t *)&pgVar25->curr_func_item)->head;
              pMVar27->data = (void *)((ulong)pMVar27->data | uVar43);
            }
            lVar42 = lVar42 + 1;
          } while (lVar42 < plVar28->finish);
        }
        plVar28 = plVar28->next;
      } while (plVar28 != (live_range_t)0x0);
    }
    pMVar27 = pMVar50;
    if (pMVar50 == (MIR_item_t_conflict)0x22) break;
LAB_0016b967:
    pVVar11 = gen_ctx_01->lr_ctx->var_live_ranges;
    if (((pVVar11 == (VARR_live_range_t *)0x0) || (pVVar11->varr == (live_range_t_conflict *)0x0))
       || ((MIR_item_t_conflict)pVVar11->els_num <= pMVar27)) goto LAB_0016cb87;
  }
  pVVar31 = gen_ctx_01->func_used_hard_regs;
  if ((pVVar31 != (bitmap_t)0x0) && (pVVar31->varr != (bitmap_el_t *)0x0)) {
    pVVar31->els_num = 0;
    if (1 < uVar2) {
      HTAB_lr_gap_t_clear(gen_ctx_01->ra_ctx->lr_gap_tab);
    }
    if (0 < (int)auStack_dc._4_4_) {
      uVar43 = 0;
      auStack_dc._4_8_ = ZEXT48(auStack_dc._4_4_ & 0x7fffffff);
      do {
        pVVar41 = gen_ctx_01->ra_ctx->sorted_regs;
        if (((pVVar41 == (VARR_allocno_info_t *)0x0) || (pVVar41->varr == (allocno_info_t *)0x0)) ||
           (pVVar41->els_num <= uVar43)) goto LAB_0016cb8c;
        pVVar5 = gen_ctx_01->ra_ctx->reg_renumber;
        if ((pVVar5 == (VARR_MIR_reg_t *)0x0) || (pVVar5->varr == (MIR_reg_t *)0x0))
        goto LAB_0016cb91;
        plVar12 = *(live_range **)(pVVar41->varr + uVar43);
        uVar36 = (ulong)plVar12 & 0xffffffff;
        if (pVVar5->els_num <= uVar36) goto LAB_0016cb91;
        uStack_b0 = uVar43;
        if (pVVar5->varr[uVar36] == 0xffffffff) {
          gen_ctx_00 = (gen_ctx_t)gen_ctx_01->ctx;
          iVar3 = (int)plVar12;
          reg = iVar3 - 0x21;
          MVar20 = MIR_reg_type((MIR_context_t)gen_ctx_00,reg,func);
          pgVar25 = pgStack_88;
          pVVar41 = gen_ctx_01->ra_ctx->sorted_regs;
          if (((pVVar41 == (VARR_allocno_info_t *)0x0) || (pVVar41->varr == (allocno_info_t *)0x0))
             || (pVVar41->els_num <= uStack_b0)) goto LAB_0016cbbe;
          if (pVVar41->varr[uVar43].tied_reg_p == 0) {
            pVVar11 = gen_ctx_01->lr_ctx->var_live_ranges;
            if (((pVVar11 == (VARR_live_range_t *)0x0) ||
                (pVVar11->varr == (live_range_t_conflict *)0x0)) || (pVVar11->els_num <= uVar36))
            goto LAB_0016cbe6;
            pMVar27 = (MIR_item_t_conflict)pVVar11->varr[uVar36];
            if (pMVar27 != (MIR_item_t_conflict)0x0) {
              if ((dst == (gen_ctx_t)0x0) || (dst->curr_func_item == (MIR_item_t)0x0))
              goto LAB_0016cc36;
              dst->ctx = (MIR_context_t)0x0;
              pMStack_b8 = pMVar27;
              do {
                if (*(int *)&pMVar27->module <= *(int *)((long)&pMVar27->module + 4)) {
                  lVar42 = (long)*(int *)&pMVar27->module + -1;
                  do {
                    gen_ctx_00 = dst;
                    bitmap_ior((bitmap_t)dst,(bitmap_t)dst,ppVVar9[lVar42 + 1]);
                    lVar42 = lVar42 + 1;
                  } while (lVar42 < *(int *)((long)&pMVar27->module + 4));
                }
                pMVar27 = (pMVar27->item_link).next;
              } while (pMVar27 != (MIR_item_t)0x0);
              prVar30 = gen_ctx_01->ra_ctx;
              pVVar13 = prVar30->spill_gaps;
              if ((pVVar13 == (VARR_lr_gap_t *)0x0) || (pVVar13->varr == (lr_gap_t *)0x0))
              goto LAB_0016cc31;
              pVVar13->els_num = 0;
              MStack_14c = 0xffffffff;
              plVar37 = (live_range *)0x0;
              pcVar47 = (char *)0x0;
              bVar45 = MVar20 == MIR_T_P || MVar20 < MIR_T_F;
              do {
                if (plVar37 < (live_range *)((long)dst->ctx << 6)) {
                  if (MVar20 != MIR_T_LD) {
                    gen_ctx_00 = (gen_ctx_t)dst->curr_func_item;
                    in_R8 = (live_range *)(1L << ((ulong)plVar37 & 0x3f) & (ulong)gen_ctx_00->ctx);
                    if (in_R8 == (live_range *)0x0) goto LAB_0016bc93;
                  }
                }
                else if (MVar20 != MIR_T_LD) {
LAB_0016bc93:
                  bVar48 = plVar37 < (live_range *)0x10 != bVar45;
                  gen_ctx_00 = (gen_ctx_t)CONCAT71((int7)((ulong)gen_ctx_00 >> 8),bVar48);
                  if (!bVar48) {
                    uVar40 = (uint)plVar37;
                    gen_ctx_00 = (gen_ctx_t)(ulong)(uVar40 & 0x3e);
                    if ((0x20 < (uVar40 & 0x3e)) ||
                       (in_R8 = (live_range *)&DAT_101000410,
                       (0x101000410U >> (long)gen_ctx_00 & 1) == 0)) {
                      if (MStack_14c == 0xffffffff) {
                        gen_ctx_00 = (gen_ctx_t)gen_ctx_01->call_used_hard_regs[0x12];
                        if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_0016cc91;
                        in_R8 = (live_range *)((long)gen_ctx_00->ctx << 6);
LAB_0016bd19:
                        MStack_14c = uVar40;
                        if (plVar37 < in_R8) {
                          pcVar47 = (char *)(ulong)(~(uint)((ulong)gen_ctx_00->curr_func_item->data
                                                           >> ((ulong)plVar37 & 0x3f)) & 1);
                        }
                        else {
                          pcVar47 = &DAT_00000001;
                        }
                      }
                      else if ((int)pcVar47 == 0) {
                        pcVar47 = (char *)0x0;
                      }
                      else {
                        gen_ctx_00 = (gen_ctx_t)gen_ctx_01->call_used_hard_regs[0x12];
                        if (gen_ctx_00 == (gen_ctx_t)0x0) goto LAB_0016cc8c;
                        pcVar47 = &DAT_00000001;
                        in_R8 = (live_range *)((long)gen_ctx_00->ctx << 6);
                        if ((plVar37 < in_R8) &&
                           (((ulong)gen_ctx_00->curr_func_item->data >> ((ulong)plVar37 & 0x3f) & 1)
                            != 0)) goto LAB_0016bd19;
                      }
                    }
                  }
                }
                plVar37 = (live_range *)((long)&plVar37->lr_bb + 1);
              } while (plVar37 != (live_range *)0x22);
              MStack_bc = reg;
              if (MStack_14c == 0xffffffff) {
                if (uVar2 < 2) {
LAB_0016c453:
                  in_R8 = (live_range *)auStack_dc;
                  MStack_14c = get_stack_loc(gen_ctx_01,prVar30->start_mem_loc,MVar20,(bitmap_t)dst,
                                             (int *)in_R8);
                  goto LAB_0016c46f;
                }
                if (prVar30->used_locs == (VARR_bitmap_t *)0x0) goto LAB_0016ccaf;
                pMVar27 = (MIR_item_t_conflict)pcVar47;
                if (prVar30->busy_used_locs == (VARR_bitmap_t *)0x0) goto LAB_0016ccb4;
                ppVVar14 = prVar30->used_locs->varr;
                prStack_c8 = (ra_ctx *)prVar30->busy_used_locs->varr;
                pMVar50 = (MIR_item_t_conflict)0x0;
                MStack_14c = 0xffffffff;
                uStack_108 = 0;
                iStack_104 = 0;
                uStack_e0 = 0;
                plStack_90 = (live_range_t)(ulong)(MVar20 << 0x10);
                lStack_98 = uVar36 << 0x20;
                do {
                  if (pMVar50 < (MIR_item_t_conflict)0x10 == bVar45 && MVar20 != MIR_T_LD) {
                    uVar40 = (uint)pMVar50;
                    if ((0x20 < (uVar40 & 0x3e)) || ((0x101000410U >> (uVar40 & 0x3e) & 1) == 0)) {
                      prVar30 = gen_ctx_01->ra_ctx;
                      pVVar13 = prVar30->curr_gaps;
                      if ((pVVar13 == (VARR_lr_gap_t *)0x0) || (pVVar13->varr == (lr_gap_t *)0x0))
                      goto LAB_0016cc73;
                      pVVar13->els_num = 0;
                      uVar39 = 0;
                      iVar4 = (int)prVar30->curr_reg_infos[uVar36].freq;
                      pMStack_80 = (MIR_item_t_conflict)
                                   ((long)&pMVar50->data + lStack_98 + (long)&plStack_90->lr_bb);
                      lr_00 = pMStack_b8;
                      do {
                        pcVar47 = &DAT_00000001;
                        gen_ctx_00 = (gen_ctx_t)((ulong)pMVar50 & 0xffffffff);
                        iVar21 = available_hreg_p(uVar40,1,(int)ppVVar14,(bitmap_t *)lr_00,in_R8);
                        if (iVar21 == 0) {
                          pcVar47 = &DAT_00000001;
                          gen_ctx_00 = (gen_ctx_t)((ulong)pMVar50 & 0xffffffff);
                          iVar21 = available_hreg_p(uVar40,1,(int)prStack_c8,(bitmap_t *)lr_00,in_R8
                                                   );
                          if (iVar21 == 0) {
                            if (lr_00->data == (void *)0x0) goto LAB_0016bf97;
                            pcVar47 = (char *)lr_00;
                            gen_ctx_00 = gen_ctx_01;
                            iVar21 = gap_lr_spill_cost(gen_ctx_01,(live_range_t_conflict)lr_00);
                            pVVar13 = gen_ctx_01->ra_ctx->curr_gaps;
                            pgVar25 = (gen_ctx_t)pVVar13->varr;
                            if (pgVar25 == (gen_ctx_t)0x0) goto LAB_0016cc27;
                            sVar33 = pVVar13->els_num;
                            uVar43 = sVar33 + 1;
                            if (pVVar13->size < uVar43) {
                              sVar33 = (uVar43 >> 1) + uVar43;
                              pcVar47 = (char *)(sVar33 * 0x10);
                              gen_ctx_00 = pgVar25;
                              pgVar25 = (gen_ctx_t)realloc(pgVar25,(size_t)pcVar47);
                              pVVar13->varr = (lr_gap_t *)pgVar25;
                              pVVar13->size = sVar33;
                              sVar33 = pVVar13->els_num;
                              uVar43 = sVar33 + 1;
                            }
                            pVVar13->els_num = uVar43;
                            pgVar25->call_used_hard_regs[sVar33 * 2 + -0xd] = (bitmap_t)pMStack_80;
                            pgVar25->call_used_hard_regs[sVar33 * 2 + -0xc] = (bitmap_t)lr_00;
                          }
                          else {
                            pMVar27 = (MIR_item_t_conflict)gen_ctx_01->ra_ctx->curr_gaps;
                            if (pMVar27 == (MIR_item_t_conflict)0x0) goto LAB_0016cbfa;
                            if (pMVar27->data == (void *)0x0) {
                              pMVar38 = (MIR_item_t_conflict)0x0;
                            }
                            else {
                              pMVar29 = (pMVar27->item_link).prev;
                              if (pMVar29 == (MIR_item_t)0x0) goto LAB_0016cc22;
                              pMVar38 = *(MIR_item_t_conflict *)
                                         ((long)pMVar29 + (long)pMVar27->data * 0x10 + -8);
                            }
                            uVar43 = (ulong)*(int *)&lr_00->module;
                            if (-1 < (long)uVar43) {
                              do {
                                pVVar31 = gen_ctx_01->ra_ctx->lr_gap_bitmaps[(long)pMVar50];
                                if (((pVVar31 != (bitmap_t)0x0) && (uVar43 < pVVar31->els_num << 6))
                                   && ((pVVar31->varr[uVar43 >> 6] >> (uVar43 & 0x3f) & 1) != 0)) {
                                  lStack_78.start = (int)uVar43;
                                  in_R8 = (live_range *)auStack_a8;
                                  gen_ctx_00 = (gen_ctx_t)gen_ctx_01->ra_ctx->lr_gap_tab;
                                  el.lr = &lStack_78;
                                  el._0_8_ = pMVar50;
                                  pcVar47 = (char *)pMVar50;
                                  iVar21 = HTAB_lr_gap_t_do((HTAB_lr_gap_t *)gen_ctx_00,el,HTAB_FIND
                                                            ,(lr_gap_t *)in_R8);
                                  lr_01 = (MIR_item_t_conflict)auStack_a8._8_8_;
                                  uVar19 = auStack_a8._0_8_;
                                  if (iVar21 != 0) {
                                    uVar23 = *(uint *)((long)(auStack_a8._8_8_ + 8) + 4);
                                    uVar43 = (ulong)uVar23;
                                    if ((int)uVar23 < (int)*(uint *)&lr_00->module) {
                                      uVar43 = (ulong)*(uint *)&lr_00->module;
                                      goto LAB_0016c188;
                                    }
                                    pcVar47 = (char *)pMVar27;
                                    if (pMVar38 == (MIR_item_t_conflict)auStack_a8._8_8_)
                                    goto LAB_0016c188;
                                    pMVar29 = (pMVar27->item_link).prev;
                                    if (pMVar29 == (MIR_item_t)0x0) goto LAB_0016ccb9;
                                    pvVar35 = pMVar27->data;
                                    pMVar34 = (MIR_module_t)((long)pvVar35 + 1);
                                    if (pMVar27->module < pMVar34) {
                                      pMVar34 = (MIR_module_t)
                                                ((long)&pMVar34->data + ((ulong)pMVar34 >> 1));
                                      pMVar29 = (MIR_item_t)realloc(pMVar29,(long)pMVar34 * 0x10);
                                      (pMVar27->item_link).prev = pMVar29;
                                      pMVar27->module = pMVar34;
                                      pvVar35 = pMVar27->data;
                                      pMVar34 = (MIR_module_t)((long)pvVar35 + 1);
                                    }
                                    pMVar27->data = pMVar34;
                                    (&pMVar29->data)[(long)pvVar35 * 2] = (void *)uVar19;
                                    (&pMVar29->module)[(long)pvVar35 * 2] = (MIR_module_t)lr_01;
                                    pcVar47 = (char *)lr_01;
                                    gen_ctx_00 = gen_ctx_01;
                                    iVar21 = gap_lr_spill_cost(gen_ctx_01,
                                                               (live_range_t_conflict)lr_01);
                                    goto LAB_0016c327;
                                  }
                                }
                                bVar48 = 0 < (long)uVar43;
                                uVar43 = uVar43 - 1;
                              } while (bVar48);
                              uVar43 = (ulong)*(uint *)&lr_00->module;
                            }
LAB_0016c188:
                            iVar21 = 0;
                            lr_01 = pMVar38;
LAB_0016c327:
                            iVar22 = *(int *)((long)&lr_00->module + 4);
                            if ((int)uVar43 < iVar22) {
                              uVar23 = (int)uVar43 + 1;
                              uVar43 = (ulong)uVar23;
                              pVVar31 = gen_ctx_01->ra_ctx->lr_gap_bitmaps[(long)pMVar50];
                              if (pVVar31 != (bitmap_t)0x0) {
                                pMVar38 = (MIR_item_t_conflict)(long)(int)uVar23;
                                pcVar47 = (char *)(pVVar31->els_num << 6);
                                if ((pMVar38 < pcVar47) &&
                                   (pcVar47 = (char *)((ulong)pMVar38 >> 6),
                                   (pVVar31->varr[(long)pcVar47] >> ((ulong)pMVar38 & 0x3f) & 1) !=
                                   0)) {
                                  in_R8 = (live_range *)auStack_a8;
                                  gen_ctx_00 = (gen_ctx_t)gen_ctx_01->ra_ctx->lr_gap_tab;
                                  el_00.lr = &lStack_78;
                                  el_00._0_8_ = pMVar50;
                                  pcVar47 = (char *)pMVar50;
                                  lStack_78.start = uVar23;
                                  iVar22 = HTAB_lr_gap_t_do((HTAB_lr_gap_t *)gen_ctx_00,el_00,
                                                            HTAB_FIND,(lr_gap_t *)in_R8);
                                  lr = auStack_a8._8_8_;
                                  uVar19 = auStack_a8._0_8_;
                                  if (iVar22 != 0) {
                                    pcVar47 = (char *)pMVar27;
                                    if (lr_01 != (MIR_item_t_conflict)auStack_a8._8_8_) {
                                      pMVar29 = (pMVar27->item_link).prev;
                                      if (pMVar29 == (MIR_item_t)0x0) goto LAB_0016cbdc;
                                      pvVar35 = pMVar27->data;
                                      pMVar34 = (MIR_module_t)((long)pvVar35 + 1);
                                      if (pMVar27->module < pMVar34) {
                                        pMVar34 = (MIR_module_t)
                                                  ((long)&pMVar34->data + ((ulong)pMVar34 >> 1));
                                        pMVar29 = (MIR_item_t)realloc(pMVar29,(long)pMVar34 * 0x10);
                                        (pMVar27->item_link).prev = pMVar29;
                                        pMVar27->module = pMVar34;
                                        pvVar35 = pMVar27->data;
                                        pMVar34 = (MIR_module_t)((long)pvVar35 + 1);
                                      }
                                      pMVar27->data = pMVar34;
                                      (&pMVar29->data)[(long)pvVar35 * 2] = (void *)uVar19;
                                      (&pMVar29->module)[(long)pvVar35 * 2] = (MIR_module_t)lr;
                                      pcVar47 = (char *)lr;
                                      gen_ctx_00 = gen_ctx_01;
                                      iVar22 = gap_lr_spill_cost(gen_ctx_01,
                                                                 (live_range_t_conflict)lr);
                                      iVar21 = iVar21 + iVar22;
                                      lr_01 = (MIR_item_t_conflict)lr;
                                    }
                                    uVar43 = (ulong)*(uint *)((long)(lr + 8) + 4);
                                  }
                                }
                              }
                              goto LAB_0016c327;
                            }
                            uVar39 = ((uVar39 + iVar22) - *(int *)&lr_00->module) + 1;
                          }
                          iVar4 = iVar4 - iVar21;
                        }
                        lr_00 = (lr_00->item_link).next;
                      } while (lr_00 != (MIR_item_t)0x0);
                      if (-1 < iVar4) {
                        pVVar31 = gen_ctx_01->call_used_hard_regs[0x12];
                        if (pVVar31 == (bitmap_t)0x0) goto LAB_0016ccaa;
                        uVar23 = 0;
                        if (pMVar50 < (MIR_item_t_conflict)(pVVar31->els_num << 6)) {
                          uVar23 = (uint)(*pVVar31->varr >> ((ulong)pMVar50 & 0x3f)) & 1;
                        }
                        if ((((MStack_14c == 0xffffffff) || (iStack_104 < iVar4)) ||
                            ((iVar4 == iStack_104 && ((uStack_108 != 0 && (uVar23 != 0)))))) ||
                           ((iVar4 == iStack_104 &&
                            ((uStack_108 == (uVar23 == 0) && ((int)uStack_e0 < (int)uVar39)))))) {
                          prVar30 = gen_ctx_01->ra_ctx;
                          pcVar47 = (char *)(ulong)uVar39;
                          uStack_108 = uVar23 ^ 1;
                          auVar18._0_8_ = prVar30->spill_gaps;
                          auVar18._8_8_ = prVar30->curr_gaps;
                          auVar18 = vpermilps_avx(auVar18,0x4e);
                          prVar30->spill_gaps = (VARR_lr_gap_t *)auVar18._0_8_;
                          prVar30->curr_gaps = (VARR_lr_gap_t *)auVar18._8_8_;
                          MStack_14c = uVar40;
                          iStack_104 = iVar4;
                          uStack_e0 = uVar39;
                        }
                      }
                    }
                  }
LAB_0016bf97:
                  pMVar50 = (MIR_item_t_conflict)((long)&pMVar50->data + 1);
                } while (pMVar50 != (MIR_item_t_conflict)0x22);
                if (MStack_14c == 0xffffffff) {
                  prVar30 = gen_ctx_01->ra_ctx;
                  goto LAB_0016c453;
                }
                setup_used_hard_regs(gen_ctx_01,MVar20,MStack_14c);
                pcVar47 = "(with splitting live ranges)";
              }
              else {
                setup_used_hard_regs(gen_ctx_01,MVar20,MStack_14c);
LAB_0016c46f:
                pcVar47 = "";
              }
              pFVar15 = (FILE *)gen_ctx_01->debug_file;
              if ((pFVar15 != (FILE *)0x0) && (1 < gen_ctx_01->debug_level)) {
                pcVar26 = MIR_reg_name(gen_ctx_01->ctx,MStack_bc,func);
                in_stack_fffffffffffffea0 = (ulong)MStack_14c;
                in_R8 = plVar12;
                fprintf(pFVar15," Assigning %s to %s:reg=%3u (freq %-3ld) -- %lu\n",pcVar47,pcVar26,
                        plVar12,gen_ctx_01->ra_ctx->curr_reg_infos[uVar36].freq,
                        in_stack_fffffffffffffea0);
                fwrite("  live range: ",0xe,1,(FILE *)gen_ctx_01->debug_file);
                print_live_ranges(gen_ctx_01,(live_range_t_conflict)pMStack_b8);
              }
              if ((bm_00 == (bitmap_t)0x0) || (bm_00->varr == (bitmap_el_t *)0x0))
              goto LAB_0016cc2c;
              bm_00->els_num = 0;
              prVar30 = gen_ctx_01->ra_ctx;
              pVVar13 = prVar30->spill_gaps;
              while( true ) {
                if (pVVar13 == (VARR_lr_gap_t *)0x0) goto LAB_0016cb9b;
                if (pVVar13->els_num == 0) break;
                plVar16 = pVVar13->varr;
                if (plVar16 == (lr_gap_t *)0x0) goto LAB_0016cba0;
                sVar33 = pVVar13->els_num - 1;
                pVVar13->els_num = sVar33;
                plVar1 = plVar16 + sVar33;
                uVar43._0_2_ = plVar1->hreg;
                uVar43._2_2_ = plVar1->type;
                uVar43._4_4_ = plVar1->reg;
                plVar28 = plVar16[sVar33].lr;
                if (((FILE *)gen_ctx_01->debug_file != (FILE *)0x0) && (3 < gen_ctx_01->debug_level)
                   ) {
                  pcVar47 = "";
                  in_R8 = (live_range *)(ulong)(uint)(int)(short)(undefined2)uVar43;
                  if (uVar43._4_4_ == iVar3) {
                    pcVar47 = "*";
                  }
                  in_stack_fffffffffffffea0 =
                       CONCAT44((int)(in_stack_fffffffffffffea0 >> 0x20),plVar28->finish);
                  fprintf((FILE *)gen_ctx_01->debug_file,
                          "   Splitting lr gap: r%d%s, h%d [%d..%d]\n",uVar43 >> 0x20,pcVar47,in_R8,
                          (ulong)(uint)plVar28->start,in_stack_fffffffffffffea0);
                }
                plVar49 = plVar28->lr_bb;
                if (plVar49 != (lr_bb_t_conflict)0x0) {
                  do {
                    pVVar31 = plVar49->bb->gen;
                    bitmap_expand(pVVar31,(uVar43 >> 0x20) + 1);
                    if (pVVar31 == (bitmap_t)0x0) {
LAB_0016cb54:
                      assign_cold_41();
LAB_0016cb59:
                      __assert_fail("lr->lr_bb != ((void*)0)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1c49,
                                    "void insert_lr_gap(gen_ctx_t, int, MIR_type_t, MIR_reg_t, live_range_t)"
                                   );
                    }
                    pVVar31->varr[uVar43 >> 0x26] =
                         pVVar31->varr[uVar43 >> 0x26] | 1L << (uVar43 >> 0x20 & 0x3f);
                    plVar49 = plVar49->next;
                  } while (plVar49 != (lr_bb_t)0x0);
                }
                if (uVar43._4_4_ == iVar3) {
                  uVar43 = (ulong)plVar28->start;
                  bitmap_expand(bm_00,uVar43 + 1);
                  bm_00->varr[uVar43 >> 6] = bm_00->varr[uVar43 >> 6] | 1L << (uVar43 & 0x3f);
                }
                else {
                  lVar42 = 0;
                  do {
                    if (plVar28->lr_bb == (lr_bb_t_conflict)0x0) {
LAB_0016cb30:
                      __assert_fail("lr->lr_bb != ((void*)0) && gen_ctx->ra_ctx->lr_gap_bitmaps[hreg] != ((void*)0)"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1c51,"void delete_lr_gap(gen_ctx_t, int, live_range_t)");
                    }
                    prVar30 = gen_ctx_01->ra_ctx;
                    uVar40 = (int)(short)(undefined2)uVar43 + (int)lVar42;
                    pVVar31 = prVar30->lr_gap_bitmaps[(int)uVar40];
                    if (pVVar31 == (bitmap_t)0x0) goto LAB_0016cb30;
                    iVar4 = plVar28->start;
                    if ((ulong)(long)iVar4 < pVVar31->els_num << 6) {
                      bVar17 = (byte)iVar4 & 0x3f;
                      pVVar31->varr[(ulong)(long)iVar4 >> 6] =
                           pVVar31->varr[(ulong)(long)iVar4 >> 6] &
                           (-2L << bVar17 | 0xfffffffffffffffeU >> 0x40 - bVar17);
                    }
                    el_01._0_4_ = uVar40 & 0xffff;
                    el_01.reg = 0;
                    el_01.lr = plVar28;
                    HTAB_lr_gap_t_do(prVar30->lr_gap_tab,el_01,HTAB_DELETE,(lr_gap_t *)&lStack_78);
                    iVar4 = plVar28->start;
                    iVar21 = plVar28->finish;
                    in_R8 = (live_range *)(long)iVar4;
                    if (iVar4 <= iVar21) {
                      bVar17 = (byte)uVar40 & 0x3f;
                      in_R8 = (live_range *)0x0;
                      do {
                        pVVar31 = ppVVar9[(long)((long)&in_R8->lr_bb +
                                                (long)&((live_range *)(long)iVar4)->lr_bb)];
                        if (pVVar31 == (bitmap_t)0x0) goto LAB_0016cafd;
                        if ((ulong)uVar40 < pVVar31->els_num << 6) {
                          pVVar31->varr[uVar40 >> 6] =
                               pVVar31->varr[uVar40 >> 6] &
                               (-2L << bVar17 | 0xfffffffffffffffeU >> 0x40 - bVar17);
                        }
                        in_R8 = (live_range *)((long)&in_R8->lr_bb + 1);
                      } while ((iVar21 - iVar4) + 1 != (int)in_R8);
                    }
                    lVar42 = lVar42 + 1;
                  } while (lVar42 != (ulong)(((uint)uVar43 & 0xffff0000) == 0xa0000 &&
                                            0x21 < (uint)(int)(short)(undefined2)uVar43) + 1);
                }
                prVar30 = gen_ctx_01->ra_ctx;
                pVVar13 = prVar30->spill_gaps;
              }
              pVVar5 = prVar30->reg_renumber;
              if (((pVVar5 == (VARR_MIR_reg_t *)0x0) || (pVVar5->varr == (MIR_reg_t *)0x0)) ||
                 (pVVar5->els_num <= uVar36)) goto LAB_0016cc0e;
              pVVar5->varr[uVar36] = MStack_14c;
              bVar45 = 0x21 < MStack_14c;
              auStack_dc._0_4_ = (MVar20 == MIR_T_LD && bVar45) + 1;
              pVVar11 = gen_ctx_01->lr_ctx->var_live_ranges;
              if (((pVVar11 == (VARR_live_range_t *)0x0) ||
                  (pVVar11->varr == (live_range_t_conflict *)0x0)) || (pVVar11->els_num <= uVar36))
              goto LAB_0016cc09;
              plVar28 = pVVar11->varr[uVar36];
              if (plVar28 != (live_range_t_conflict)0x0) {
                uVar43 = (ulong)(uint)auStack_dc._0_4_;
                do {
                  uVar46 = (ulong)plVar28->start;
                  if (((uVar2 < 2 || bVar45) || (bm_00->els_num << 6 <= uVar46)) ||
                     ((bm_00->varr[uVar46 >> 6] >> (uVar46 & 0x3f) & 1) == 0)) {
                    uVar51 = uVar43;
                    uVar40 = MStack_14c;
                    if (plVar28->start <= plVar28->finish) {
                      do {
                        pVVar31 = ppVVar9[uVar46];
                        bitmap_expand(pVVar31,(ulong)uVar40 + 1);
                        if (pVVar31 == (bitmap_t)0x0) {
                          assign_cold_44();
LAB_0016cafd:
                          assign_cold_42();
LAB_0016cb02:
                          assign_cold_26();
LAB_0016cb07:
                          assign_cold_25();
                          goto LAB_0016cb0c;
                        }
                        pVVar31->varr[uVar40 >> 6] =
                             pVVar31->varr[uVar40 >> 6] | 1L << ((ulong)uVar40 & 0x3f);
                        uVar51 = uVar51 - 1;
                        uVar40 = uVar40 + 1;
                      } while ((uVar51 != 0) ||
                              (bVar48 = (long)uVar46 < (long)plVar28->finish, uVar51 = uVar43,
                              uVar40 = MStack_14c, uVar46 = uVar46 + 1, bVar48));
                    }
                    if (uVar2 >= 2 && !bVar45) {
                      uVar46 = uVar43;
                      uVar40 = MStack_14c;
                      if (plVar28->lr_bb == (lr_bb_t_conflict)0x0) goto LAB_0016ca69;
                      do {
                        if (((FILE *)gen_ctx_01->debug_file != (FILE *)0x0) &&
                           (3 < gen_ctx_01->debug_level)) {
                          fprintf((FILE *)gen_ctx_01->debug_file,
                                  "    Adding lr gap: r%d, h%d [%d..%d]\n",plVar12,(ulong)uVar40,
                                  (ulong)(uint)plVar28->start,(ulong)(uint)plVar28->finish);
                        }
                        if (plVar28->lr_bb == (lr_bb_t_conflict)0x0) goto LAB_0016cb59;
                        uVar51 = (ulong)plVar28->start;
                        pVVar31 = gen_ctx_01->ra_ctx->lr_gap_bitmaps[(int)uVar40];
                        if (pVVar31 == (bitmap_t)0x0) {
                          uVar39 = (plVar28->start * 3) / 2 + 0x3f;
                          uVar44 = (ulong)(long)(int)uVar39 >> 6;
                          prStack_c8 = gen_ctx_01->ra_ctx;
                          pVVar31 = (bitmap_t)malloc(0x18);
                          pVVar31->els_num = 0;
                          if (uVar39 < 0x40) {
                            uVar44 = 0x40;
                          }
                          pVVar31->size = uVar44;
                          pbVar32 = (bitmap_el_t *)malloc(uVar44 << 3);
                          pVVar31->varr = pbVar32;
                          prStack_c8->lr_gap_bitmaps[(int)uVar40] = pVVar31;
                          pVVar31 = gen_ctx_01->ra_ctx->lr_gap_bitmaps[(int)uVar40];
                          bitmap_expand(pVVar31,uVar51 + 1);
                          if (pVVar31 == (bitmap_t)0x0) goto LAB_0016cb7d;
                        }
                        else {
                          bitmap_expand(pVVar31,uVar51 + 1);
                        }
                        in_R8 = &lStack_78;
                        el_02._0_8_ = (ulong)(uVar40 & 0xffff | MVar20 << 0x10) | uVar36 << 0x20;
                        pVVar31->varr[uVar51 >> 6] =
                             pVVar31->varr[uVar51 >> 6] | 1L << (uVar51 & 0x3f);
                        el_02.lr = plVar28;
                        HTAB_lr_gap_t_do(gen_ctx_01->ra_ctx->lr_gap_tab,el_02,HTAB_INSERT,
                                         (lr_gap_t *)in_R8);
                        uVar46 = uVar46 - 1;
                        uVar40 = uVar40 + 1;
                      } while (uVar46 != 0);
                    }
                  }
                  else if (plVar28->lr_bb == (lr_bb_t_conflict)0x0) {
LAB_0016ca69:
                    uVar46 = uVar43;
                    uVar40 = MStack_14c;
                    lVar42 = (long)plVar28->start;
                    if (plVar28->start <= plVar28->finish) {
                      do {
                        pVVar31 = (bitmap_t)((void **)auStack_dc._12_8_)[lVar42];
                        bitmap_expand(pVVar31,(ulong)uVar40 + 1);
                        if (pVVar31 == (bitmap_t)0x0) {
LAB_0016cb0c:
                          assign_cold_46();
LAB_0016cb11:
                          __assert_fail("bitmap_bit_p (used_locs_addr[j], hard_reg)",
                                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                        ,0x1db1,"void assign(gen_ctx_t)");
                        }
                        pVVar31->varr[uVar40 >> 6] =
                             pVVar31->varr[uVar40 >> 6] | 1L << ((ulong)uVar40 & 0x3f);
                        uVar46 = uVar46 - 1;
                        uVar40 = uVar40 + 1;
                      } while ((uVar46 != 0) ||
                              (bVar48 = lVar42 < plVar28->finish, uVar46 = uVar43,
                              uVar40 = MStack_14c, lVar42 = lVar42 + 1, bVar48));
                    }
                  }
                  plVar28 = plVar28->next;
                } while (plVar28 != (live_range_t)0x0);
              }
            }
          }
          else {
            pcVar47 = MIR_reg_hard_reg_name((MIR_context_t)pgStack_88,reg,func);
            uVar40 = _MIR_get_hard_reg((MIR_context_t)pgVar25,pcVar47);
            if (0x21 < uVar40) goto LAB_0016cc4a;
            pVVar5 = gen_ctx_01->ra_ctx->reg_renumber;
            if (((pVVar5 == (VARR_MIR_reg_t *)0x0) || (pVVar5->varr == (MIR_reg_t *)0x0)) ||
               (pVVar5->els_num <= uVar36)) goto LAB_0016cbeb;
            pVVar5->varr[uVar36] = uVar40;
            pVVar11 = gen_ctx_01->lr_ctx->var_live_ranges;
            if (((pVVar11 == (VARR_live_range_t *)0x0) ||
                (pVVar11->varr == (live_range_t_conflict *)0x0)) || (pVVar11->els_num <= uVar36))
            goto LAB_0016cbe1;
            plVar28 = pVVar11->varr[uVar36];
            if (plVar28 != (live_range_t_conflict)0x0) {
              do {
                iVar3 = plVar28->start;
                in_R8 = (live_range *)(long)iVar3;
                if (iVar3 <= plVar28->finish) {
                  in_R8 = (live_range *)0x0;
                  do {
                    pVVar31 = ppVVar9[(long)((long)&in_R8->lr_bb +
                                            (long)&((live_range *)(long)iVar3)->lr_bb)];
                    if (pVVar31 == (bitmap_t)0x0) {
                      assign_cold_27();
                      goto LAB_0016cb54;
                    }
                    if ((pVVar31->els_num << 6 <= (ulong)uVar40) ||
                       ((*pVVar31->varr & 1L << ((ulong)uVar40 & 0x3f)) == 0)) goto LAB_0016cb11;
                    in_R8 = (live_range *)((long)&in_R8->lr_bb + 1);
                  } while ((plVar28->finish - iVar3) + 1 != (int)in_R8);
                }
                plVar28 = plVar28->next;
              } while (plVar28 != (live_range_t)0x0);
            }
            if (pcVar47 == (char *)0x0) {
              setup_used_hard_regs(gen_ctx_01,MVar20,uVar40);
            }
            pFVar15 = (FILE *)gen_ctx_01->debug_file;
            if ((pFVar15 != (FILE *)0x0) && (1 < gen_ctx_01->debug_level)) {
              pcVar47 = MIR_reg_name(gen_ctx_01->ctx,reg,func);
              in_R8 = (live_range *)gen_ctx_01->ra_ctx->curr_reg_infos[uVar36].freq;
              fprintf(pFVar15," Assigning to global %s:reg=%3u (freq %-3ld) -- %lu\n",pcVar47,
                      plVar12,in_R8,(ulong)uVar40);
            }
          }
        }
        uVar43 = uStack_b0 + 1;
      } while (uVar43 != auStack_dc._4_8_);
    }
    return;
  }
LAB_0016cc82:
  assign_cold_57();
LAB_0016cc87:
  assign_cold_8();
LAB_0016cc8c:
  assign_cold_30();
LAB_0016cc91:
  assign_cold_31();
LAB_0016cc96:
  assign_cold_66();
LAB_0016cc9b:
  assign_cold_61();
LAB_0016cca0:
  assign_cold_60();
LAB_0016cca5:
  assign_cold_59();
LAB_0016ccaa:
  assign_cold_36();
LAB_0016ccaf:
  assign_cold_40();
  pMVar27 = (MIR_item_t_conflict)pcVar47;
LAB_0016ccb4:
  assign_cold_39();
LAB_0016ccb9:
  assign_cold_33();
  output_bitmap(gen_ctx_00,"  live_in:",*(bitmap_t *)&pMVar27[1].item_type,1,(MIR_reg_t *)0x0);
  output_bitmap(gen_ctx_00,"  live_out:",(bitmap_t)pMVar27[1].ref_def,1,(MIR_reg_t *)0x0);
  output_bitmap(gen_ctx_00,"  spill_gen:",(bitmap_t)pMVar27[1].addr,1,(MIR_reg_t *)0x0);
  output_bitmap(gen_ctx_00,"  spill_kill:",*(bitmap_t *)&pMVar27[1].export_p,1,(MIR_reg_t *)0x0);
  return;
}

Assistant:

static void update_bitmap_after_coalescing (gen_ctx_t gen_ctx, bitmap_t bm) {
  MIR_reg_t reg, first_reg;
  size_t nel;
  bitmap_iterator_t bi;

  FOREACH_BITMAP_BIT (bi, bm, nel) {
    reg = (MIR_reg_t) nel;
    if (reg <= MAX_HARD_REG) continue;
    if ((first_reg = VARR_GET (MIR_reg_t, first_coalesced_reg, reg)) == reg) continue;
    bitmap_clear_bit_p (bm, reg);
    bitmap_set_bit_p (bm, first_reg);
  }
}